

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O1

ObjTypeSpecFldInfo *
ObjTypeSpecFldInfo::CreateFrom
          (uint id,PolymorphicInlineCache *cache,uint cacheId,EntryPointInfo *entryPoint,
          FunctionBody *topFunctionBody,FunctionBody *functionBody,
          FieldAccessStatsPtr inlineCacheStats)

{
  long *plVar1;
  DynamicType *this;
  code *pcVar2;
  bool bVar3;
  EntryPointInfo *this_00;
  bool bVar4;
  uint uVar5;
  PropertyId propertyId;
  BOOL BVar6;
  uint uVar7;
  undefined4 *puVar8;
  DynamicProfileInfo *pDVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  ulong uVar10;
  ScriptContext *pSVar11;
  PropertyRecord *pPVar12;
  ulong uVar13;
  Recycler *pRVar14;
  PolymorphicInlineCache *pPVar15;
  NativeEntryPointData *this_01;
  PropertyGuard *pPVar16;
  intptr_t iVar17;
  ObjTypeSpecPolymorphicInfo *__s;
  void *pvVar18;
  void *extraout_RAX;
  RecyclerJITTypeHolder *types;
  JITType *this_02;
  EquivalentTypeSet *this_03;
  ObjTypeSpecFldInfo *this_04;
  JITTypeHolder JVar19;
  byte bVar20;
  long lVar21;
  uint uVar22;
  Type *pTVar23;
  Var pvVar24;
  char cVar25;
  ushort uVar26;
  undefined8 in_R10;
  ulong uVar27;
  uint16 uVar28;
  int iVar29;
  DynamicType *dynamicType;
  ulong uVar30;
  ushort *puVar31;
  FunctionBody *pFVar32;
  InlineCache *inlineCache;
  JitTransferData *pJVar33;
  InlineCache *this_05;
  RecyclerJITTypeHolder *addr;
  TypeId TVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 local_428 [8];
  FixedFieldInfo localFixedFieldInfoArray [4];
  Type *localTypes [32];
  ObjTypeSpecPolymorphicInfo localPolymorphicInfo [32];
  undefined **local_120;
  JavascriptFunction *fixedFunctionObject;
  ulong local_110;
  char *local_108;
  DWORD local_100;
  EntryPointInfo *local_f8;
  Var local_f0;
  Var fixedProperty;
  long local_e0;
  ulong local_d8;
  DynamicObject *local_d0;
  uint local_c4;
  PropertyGuard *local_c0;
  FunctionBody *local_b8;
  ulong local_b0;
  ScriptContext *local_a8;
  TypeId local_9c;
  ulong local_98;
  Phases *local_90;
  uint local_84;
  PolymorphicInlineCache *local_80;
  ulong local_78;
  ulong local_70;
  undefined8 local_68;
  undefined8 local_60;
  ObjTypeSpecPolymorphicInfo *local_58;
  Recycler *local_50;
  ulong local_48;
  uint local_3c;
  uint local_38;
  uint16 local_32;
  
  local_c0 = (PropertyGuard *)CONCAT44(local_c0._4_4_,cacheId);
  local_f8 = entryPoint;
  if ((topFunctionBody->dynamicProfileInfo).ptr == (DynamicProfileInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x2d6,"(topFunctionBody->HasDynamicProfileInfo())",
                       "topFunctionBody->HasDynamicProfileInfo()");
    if (!bVar4) goto LAB_0061906c;
    *puVar8 = 0;
  }
  pDVar9 = Js::FunctionBody::GetAnyDynamicProfileInfo(topFunctionBody);
  local_80 = cache;
  if (cache->cloneForJitTimeUse == true) {
    bVar4 = Js::FunctionBody::PolyInliningUsingFixedMethodsAllowedByConfigFlags
                      (functionBody,topFunctionBody);
    local_60 = (JitTransferData *)CONCAT44(local_60._4_4_,(int)CONCAT71(extraout_var,bVar4));
  }
  else {
    local_60 = (JitTransferData *)((ulong)local_60._4_4_ << 0x20);
  }
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
  local_68 = functionBody;
  if ((topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_0061906c;
    *puVar8 = 0;
  }
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,EquivObjTypeSpecPhase,uVar5,
                     ((topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                      functionInfo.ptr)->functionId);
  pPVar15 = local_80;
  if (bVar4) {
    if ((char)local_60 == '\0') {
      return (ObjTypeSpecFldInfo *)0x0;
    }
  }
  else if (((char)local_60 == '\0') && (*(int *)&pDVar9->bits < 0)) {
    return (ObjTypeSpecFldInfo *)0x0;
  }
  if (local_80->size == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x2e3,"(cache->GetSize() < (65535))","cache->GetSize() < UINT16_MAX");
    if (!bVar4) goto LAB_0061906c;
    *puVar8 = 0;
  }
  pJVar33 = (JitTransferData *)pPVar15->inlineCaches;
  local_48 = CONCAT44(local_48._4_4_,(uint)pPVar15->size);
  local_c4 = id;
  if (topFunctionBody == local_68) {
    local_3c = 0;
  }
  else {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
    if ((topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) goto LAB_0061906c;
      *puVar8 = 0;
    }
    bVar4 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,DepolymorphizeInlineesPhase,uVar5,
                       ((topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                        functionInfo.ptr)->functionId);
    local_3c = (uint)CONCAT71(extraout_var_00,bVar4) ^ 1;
  }
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunctionBody);
  if ((topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_0061906c;
    *puVar8 = 0;
  }
  local_b8 = topFunctionBody;
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015b30e0,EquivObjTypeSpecPhase,uVar5,
                     ((topFunctionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                      functionInfo.ptr)->functionId);
  local_32 = 0;
  local_a8 = (ScriptContext *)__tls_get_addr();
  uVar13 = CONCAT71(extraout_var_01,bVar4) & 0xffffffff;
  TVar34 = TypeIds_Limit;
  local_70 = CONCAT62((int6)((ulong)in_R10 >> 0x10),0xffff);
  uVar36 = 1;
  local_50 = (Recycler *)0x0;
  local_90 = (Phases *)&DAT_015bbe90;
  uVar22 = 0;
  local_38 = (uint)CONCAT71(extraout_var_01,bVar4);
  local_84 = 0;
  local_78 = 0;
  local_b0 = 0;
  local_98 = 0;
  pvVar24 = (Var)0x0;
  uVar35 = 0;
  local_e0 = 0;
  local_d0 = (DynamicObject *)0x0;
  uVar27 = (ulong)local_60 & 0xffffffff;
  local_58 = (ObjTypeSpecPolymorphicInfo *)CONCAT71(local_58._1_7_,(char)uVar13);
  iVar29 = (uint)local_48;
  while( true ) {
    uVar26 = (ushort)local_70;
    if ((((((char)uVar13 == '\0') && (uVar36 == 0)) && ((uVar27 & 1) == 0)) && ((local_3c & 1) == 0)
        ) || ((ushort)iVar29 <= (ushort)uVar22)) break;
    uVar30 = (ulong)((uVar22 & 0xffff) << 5);
    uVar10 = *(ulong *)((long)&(pJVar33->jitTimeTypeRefs).ptr + uVar30);
    if (uVar10 != 0) {
      puVar31 = (ushort *)((long)&(pJVar33->jitTimeTypeRefs).ptr + uVar30);
      if (uVar26 == 0xffff) {
        if ((puVar31[8] & 1) == 0) {
          if ((*puVar31 & 1) == 0) {
            fixedProperty = pvVar24;
            local_d8 = uVar35;
            if ((puVar31[4] & 1) == 0) {
              AssertCount = AssertCount + 1;
              local_60 = pJVar33;
              Js::Throw::LogAssert();
              pSVar11 = local_a8;
              *(undefined4 *)&(local_a8->super_ScriptContextInfo)._vptr_ScriptContextInfo = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                                 ,0x323,"(inlineCache.IsAccessor())","inlineCache.IsAccessor()");
              if (!bVar4) goto LAB_0061906e;
              *(undefined4 *)&(pSVar11->super_ScriptContextInfo)._vptr_ScriptContextInfo = 0;
              pJVar33 = local_60;
            }
            pFVar32 = local_68;
            local_9c = TVar34;
            uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_68);
            if ((pFVar32->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
                (FunctionInfo *)0x0) {
              local_60 = (JitTransferData *)CONCAT44(local_60._4_4_,uVar5);
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              pSVar11 = local_a8;
              *(undefined4 *)&(local_a8->super_ScriptContextInfo)._vptr_ScriptContextInfo = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                 ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
              if (!bVar4) {
LAB_0061906e:
                local_32 = (uint16)local_50;
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              *(undefined4 *)&(pSVar11->super_ScriptContextInfo)._vptr_ScriptContextInfo = 0;
              pFVar32 = local_68;
              uVar5 = (uint)local_60;
            }
            bVar4 = Js::Phases::IsEnabled
                              (local_90,FixAccessorPropsPhase,uVar5,
                               ((pFVar32->super_ParseableFunctionInfo).super_FunctionProxy.
                                functionInfo.ptr)->functionId);
            if (bVar4) {
              local_38 = 0;
              uVar36 = 0;
              pvVar24 = fixedProperty;
              uVar35 = local_d8;
              TVar34 = local_9c;
            }
            else {
              uVar7 = *(uint *)(puVar31 + 4);
              local_78 = (ulong)CONCAT31((int3)(~uVar7 >> 8),(~uVar7 & 3) == 0);
              local_84 = CONCAT31((int3)(uVar7 >> 8),(byte)uVar7 >> 3);
              local_e0 = *(long *)puVar31;
              uVar27 = *(ulong *)(puVar31 + 8);
              TVar34 = *(TypeId *)(uVar27 & 0xfffffffffffffffb);
              pvVar24 = (Var)CONCAT71((int7)(uVar27 >> 8),(byte)uVar27 >> 2);
              uVar35 = (ulong)puVar31[5];
              local_b0 = CONCAT71((int7)((uVar27 & 0xfffffffffffffffb) >> 8),1);
            }
            uVar27 = 0;
            uVar13 = (ulong)local_58 & 0xff;
            iVar29 = (uint)local_48;
          }
          else if ((*puVar31 & 2) == 0) {
            uVar35 = *(ulong *)(puVar31 + 4);
            TVar34 = *(TypeId *)(uVar35 & 0xfffffffffffffffb);
            pvVar24 = (Var)CONCAT71((int7)(uVar35 >> 8),(byte)uVar35 >> 2);
            uVar35 = (ulong)puVar31[1];
            local_d0 = *(DynamicObject **)(puVar31 + 8);
            local_98 = CONCAT71((int7)((ulong)local_d0 >> 8),1);
          }
          else {
            local_38 = 0;
            local_3c = 0;
            uVar36 = 0;
            uVar27 = 0;
          }
        }
        else {
          TVar34 = *(TypeId *)(uVar10 & 0xfffffffffffffffb);
          uVar27 = 0;
          uVar35 = (ulong)puVar31[9];
          local_3c = local_3c & 0xff;
          if (*(long *)(puVar31 + 4) != 0) {
            uVar36 = uVar27;
            local_3c = 0;
          }
          pvVar24 = (Var)(CONCAT71((int7)(uVar10 >> 8),(byte)uVar10 >> 2) & 0xffffffff);
        }
        if (((char)uVar13 == '\0') || ((local_38 & 1) != 0)) {
          local_70 = (ulong)uVar22;
        }
      }
      else {
        uVar26 = (ushort)uVar35;
        bVar20 = (byte)pvVar24;
        if ((puVar31[8] & 1) == 0) {
          if ((*puVar31 & 1) == 0) {
            if ((uVar26 != puVar31[5]) || ((*(uint *)(puVar31 + 8) >> 2 & 1) != (uint)(bVar20 & 1)))
            {
              uVar36 = 0;
            }
            if ((local_b0 & 1) != 0) {
              if ((((((~*(uint *)(puVar31 + 4) & 3) == 0 ^ (byte)local_78) & 1) == 0) &&
                  ((*(uint *)(puVar31 + 4) & 8) != 0)) &&
                 (((local_84 & 1) != 0 && (local_e0 == *(long *)puVar31)))) {
                uVar10 = *(ulong *)(puVar31 + 8);
                goto LAB_00617d0f;
              }
            }
            goto LAB_00617d18;
          }
          if ((uVar26 != puVar31[1]) || ((*(uint *)(puVar31 + 4) >> 2 & 1) != (uint)(bVar20 & 1))) {
            uVar36 = 0;
          }
          if (((((local_98 & 1) == 0) || ((local_b0 & 1) != 0)) ||
              (local_d0 != *(DynamicObject **)(puVar31 + 8))) ||
             (TVar34 != *(TypeId *)(*(ulong *)(puVar31 + 4) & 0xfffffffffffffffb))) {
            local_3c = 0;
            uVar36 = 0;
          }
        }
        else {
          if ((uVar26 != puVar31[9]) || (((uint)(uVar10 >> 2) & 1) != (uint)(bVar20 & 1))) {
            uVar36 = 0;
          }
          if ((((local_98 & 1) == 0) && ((local_b0 & 1) == 0)) && (*(long *)(puVar31 + 4) == 0)) {
LAB_00617d0f:
            if (TVar34 != *(TypeId *)(uVar10 & 0xfffffffffffffffb)) goto LAB_00617d18;
          }
          else {
LAB_00617d18:
            local_3c = 0;
            uVar36 = 0;
          }
          uVar27 = 0;
        }
      }
      local_50 = (Recycler *)(ulong)((int)local_50 + 1);
    }
    uVar22 = uVar22 + 1;
  }
  local_32 = (uint16)local_50;
  if (uVar26 == 0xffff) {
    if (inlineCacheStats != (FieldAccessStatsPtr)0x0) {
      inlineCacheStats->emptyPolyInlineCacheCount = inlineCacheStats->emptyPolyInlineCacheCount + 1;
    }
    return (ObjTypeSpecFldInfo *)0x0;
  }
  bVar4 = local_80->ignoreForEquivalentObjTypeSpec != false;
  uVar22 = local_38 & 0xff;
  if (bVar4) {
    uVar22 = 0;
  }
  local_90 = (Phases *)CONCAT44(local_90._4_4_,uVar22);
  uVar7 = (uint)uVar36;
  local_38 = 0;
  if (bVar4) {
    uVar7 = 0;
  }
  bVar20 = (byte)uVar27 & local_32 < 5;
  if (uVar7 == 0) {
    if ((uVar22 & 1) == 0) {
      if (inlineCacheStats != (FieldAccessStatsPtr)0x0) {
        inlineCacheStats->nonEquivPolyInlineCacheCount =
             inlineCacheStats->nonEquivPolyInlineCacheCount + 1;
      }
      local_80->ignoreForEquivalentObjTypeSpec = true;
      local_38 = local_3c;
      if ((bVar20 == 0) && ((local_3c & 1) == 0)) {
        return (ObjTypeSpecFldInfo *)0x0;
      }
    }
    else {
      local_38 = 0;
    }
  }
  local_60 = (JitTransferData *)CONCAT44(local_60._4_4_,(int)CONCAT71((int7)(uVar27 >> 8),bVar20));
  cVar25 = (char)uVar13;
  local_3c = uVar7;
  if ((ushort)iVar29 <= uVar26) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x38c,"(firstNonEmptyCacheIndex < polyCacheSize)",
                       "firstNonEmptyCacheIndex < polyCacheSize");
    if (!bVar4) goto LAB_0061906c;
    *puVar8 = 0;
    iVar29 = (uint)local_48;
    cVar25 = (char)local_58;
  }
  if (TVar34 == TypeIds_Limit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x38d,"(typeId != Js::TypeIds_Limit)","typeId != Js::TypeIds_Limit");
    if (!bVar4) goto LAB_0061906c;
    *puVar8 = 0;
    iVar29 = (uint)local_48;
    cVar25 = (char)local_58;
  }
  uVar36 = local_70;
  if (inlineCacheStats != (FieldAccessStatsPtr)0x0) {
    inlineCacheStats->equivPolyInlineCacheCount = inlineCacheStats->equivPolyInlineCacheCount + 1;
  }
  if (cVar25 != '\0') {
    if ((((byte)local_3c ^ (byte)local_90) & 1) != 0) {
      iVar29 = (int)local_70 + 1;
    }
    local_48 = CONCAT44(local_48._4_4_,iVar29);
  }
  fixedProperty = pvVar24;
  local_d8 = uVar35;
  pSVar11 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)local_68);
  local_50 = pSVar11->recycler;
  memset(local_428,0,0x180);
  local_f0 = (Var)0x0;
  if ((((local_98 & 1) != 0) || ((local_84 & 1) != 0)) &&
     (((local_3c & 1) != 0 || (((ulong)local_90 & 1) != 0)))) {
    propertyId = Js::FunctionBody::GetPropertyIdFromCacheId(local_68,(uint)local_c0);
    pPVar12 = Js::ScriptContext::GetPropertyName(pSVar11,propertyId);
    if ((local_98 & 1) == 0) {
      if ((local_84 & 1) != 0) {
        plVar1 = *(long **)(*(long *)(local_e0 + 8) + 0x28);
        (**(code **)(*plVar1 + 0x2d8))(plVar1,pPVar12,&local_f0,4,(byte)local_78 & 1,pSVar11);
      }
    }
    else {
      plVar1 = *(long **)((local_d0->super_RecyclableObject).type.ptr + 1);
      (**(code **)(*plVar1 + 0x2d0))(plVar1,pPVar12,&local_f0,3,pSVar11);
    }
    FixedFieldInfo::PopulateFixedField((Type *)0x0,local_f0,(FixedFieldInfo *)local_428);
  }
  localTypes[0x1f] = (Type *)0x0;
  bVar4 = (ushort)uVar36 < (ushort)local_48;
  cVar25 = (char)local_58;
  uVar22 = (uint)local_60;
  local_a8 = pSVar11;
  if (bVar4) {
    uVar36 = uVar36 & 0xffff;
    uVar35 = (ulong)((uint)local_48 & 0xffff);
    local_80 = (PolymorphicInlineCache *)CONCAT71(local_80._1_7_,(byte)local_3c | (byte)local_90);
    this_05 = (InlineCache *)
              ((long)&(pJVar33->jitTimeTypeRefs).ptr + (ulong)(uint)((int)uVar36 << 5));
    uVar27 = -uVar35;
    local_78 = local_78 & 0xffffffff00000000;
    uVar26 = 0;
    local_9c = TVar34;
    local_70 = uVar27;
    local_48 = uVar35;
    do {
      uVar36 = uVar36 + 1;
      uVar13 = *(ulong *)&this_05->u;
      if (uVar13 == 0) {
        iVar29 = 0x11;
      }
      else {
        if ((undefined1  [24])((undefined1  [24])this_05->u & (undefined1  [24])0x1) ==
            (undefined1  [24])0x0) {
          if ((undefined1  [24])((undefined1  [24])this_05->u & (undefined1  [24])0x1) ==
              (undefined1  [24])0x0) {
            uVar13 = *(ulong *)((long)&this_05->u + 0x10);
            localTypes[(ulong)uVar26 - 1] = (Type *)(uVar13 & 0xfffffffffffffffb);
            lVar21 = 10;
          }
          else {
            uVar13 = *(ulong *)((long)&this_05->u + 8);
            localTypes[(ulong)uVar26 - 1] = (Type *)(uVar13 & 0xfffffffffffffffb);
            lVar21 = 2;
          }
          if ((local_38 & 1) != 0) {
LAB_0061824f:
            localPolymorphicInfo[(ulong)uVar26 - 2].m_data.slotIndex =
                 *(Type *)((long)&this_05->u + lVar21);
            localPolymorphicInfo[(ulong)uVar26 - 2].m_data.usesAuxSlot = (byte)uVar13 >> 2 & 1;
          }
        }
        else {
          localTypes[(ulong)uVar26 - 1] = (Type *)(uVar13 & 0xfffffffffffffffb);
          if ((local_38 & 1) != 0) {
            lVar21 = 0x12;
            goto LAB_0061824f;
          }
        }
        if ((uVar22 & 1) != 0) {
          local_120 = (undefined **)0x0;
          Js::InlineCache::TryGetFixedMethodFromCache
                    (this_05,local_68,(uint)local_c0,(JavascriptFunction **)&stack0xfffffffffffffee0
                    );
          if (((JavascriptFunction *)local_120 == (JavascriptFunction *)0x0) ||
             ((((((JavascriptFunction *)local_120)->functionInfo).ptr)->functionBodyImpl).ptr ==
              (FunctionProxy *)0x0)) {
            if (((ulong)local_80 & 1) == 0) {
              iVar29 = 1;
              bVar3 = false;
            }
            else {
              uVar26 = uVar26 + 1;
              iVar29 = 0x11;
              bVar3 = false;
              uVar22 = 0;
            }
          }
          else {
            FixedFieldInfo::PopulateFixedField
                      (localTypes[(ulong)uVar26 - 1],local_120,
                       (FixedFieldInfo *)(local_428 + (uint)uVar26 * 0x60));
            local_78 = CONCAT44(local_78._4_4_,(uint)local_78 + 1);
            iVar29 = 0;
            bVar3 = true;
          }
          uVar35 = local_48;
          uVar27 = local_70;
          cVar25 = (char)local_58;
          if (!bVar3) goto LAB_0061830d;
        }
        uVar26 = uVar26 + 1;
        iVar29 = 0;
      }
LAB_0061830d:
      if ((iVar29 != 0x11) && (iVar29 != 0)) break;
      bVar4 = uVar36 < uVar35;
      this_05 = this_05 + 1;
    } while (uVar27 + uVar36 != 0);
    uVar7 = (uint)local_78;
  }
  else {
    uVar26 = 0;
    uVar7 = 0;
    local_9c = TVar34;
  }
  pFVar32 = local_68;
  if (bVar4) {
    return (ObjTypeSpecFldInfo *)0x0;
  }
  if ((((byte)local_b0 & (byte)uVar22 & 1) != 0) && (1 < (ushort)uVar7)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x3fb,"(fixedFunctionCount <= 1)","fixedFunctionCount <= 1");
    if (!bVar4) goto LAB_0061906c;
    *puVar8 = 0;
    cVar25 = (char)local_58;
  }
  pSVar11 = local_a8;
  if ((cVar25 != '\0') && ((((byte)local_3c ^ (byte)local_90) & 1) != 0)) {
    local_32 = 1;
  }
  if (uVar26 != local_32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x403,"(typeNumber == typeCount)","typeNumber == typeCount");
    if (!bVar4) goto LAB_0061906c;
    *puVar8 = 0;
  }
  local_48 = (ulong)(uVar7 & 0xffff);
  if ((uVar22 & 1) == 0) {
    local_120 = &FixedFieldInfo::typeinfo;
    fixedFunctionObject = (JavascriptFunction *)0x0;
    local_110 = 1;
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
    ;
    local_100 = 0x411;
    pRVar14 = Memory::Recycler::TrackAllocInfo(local_50,(TrackAllocData *)&stack0xfffffffffffffee0);
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_0061906c;
      *puVar8 = 0;
    }
    pPVar15 = (PolymorphicInlineCache *)
              Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                        (pRVar14,0x60);
    if (pPVar15 == (PolymorphicInlineCache *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_0061906c;
      *puVar8 = 0;
    }
    pPVar15[3].inlineCaches = (Type)0x0;
    pPVar15[3].size = 0;
    pPVar15[3].ignoreForEquivalentObjTypeSpec = false;
    pPVar15[3].cloneForJitTimeUse = false;
    pPVar15[3].inlineCachesFillInfo = 0;
    pPVar15[2].size = 0;
    pPVar15[2].ignoreForEquivalentObjTypeSpec = false;
    pPVar15[2].cloneForJitTimeUse = false;
    pPVar15[2].inlineCachesFillInfo = 0;
    pPVar15[3].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
         (_func_int **)0x0;
    pPVar15[2].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
         (_func_int **)0x0;
    pPVar15[2].inlineCaches = (Type)0x0;
    pPVar15[1].inlineCaches = (Type)0x0;
    pPVar15[1].size = 0;
    pPVar15[1].ignoreForEquivalentObjTypeSpec = false;
    pPVar15[1].cloneForJitTimeUse = false;
    pPVar15[1].inlineCachesFillInfo = 0;
    pPVar15->size = 0;
    pPVar15->ignoreForEquivalentObjTypeSpec = false;
    pPVar15->cloneForJitTimeUse = false;
    pPVar15->inlineCachesFillInfo = 0;
    pPVar15[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
         (_func_int **)0x0;
    (pPVar15->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
         (_func_int **)0x0;
    pPVar15->inlineCaches = (Type)0x0;
    uVar35 = 1;
  }
  else {
    local_120 = &FixedFieldInfo::typeinfo;
    fixedFunctionObject = (JavascriptFunction *)0x0;
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
    ;
    local_100 = 0x40b;
    local_110 = local_48;
    pRVar14 = Memory::Recycler::TrackAllocInfo(local_50,(TrackAllocData *)&stack0xfffffffffffffee0);
    if ((ushort)uVar7 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar14,(TrackAllocData *)0x0);
      pPVar15 = (PolymorphicInlineCache *)&DAT_00000008;
      uVar35 = local_48;
    }
    else {
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_0061906c;
        *puVar8 = 0;
      }
      uVar35 = local_48;
      pPVar15 = (PolymorphicInlineCache *)
                Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                          (pRVar14,(ulong)(uint)((int)local_48 << 5) * 3);
      if (pPVar15 == (PolymorphicInlineCache *)0x0) {
        AssertCount = AssertCount + 1;
        local_80 = pPVar15;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) goto LAB_0061906c;
        *puVar8 = 0;
        pPVar15 = local_80;
        uVar35 = local_48;
      }
      memset(pPVar15,0,(((ulong)(uint)((int)uVar35 * 0x60) - 0x60) / 0x60) * 0x60 + 0x60);
    }
  }
  local_80 = pPVar15;
  Memory::CopyArray<FixedFieldInfo,Memory::WriteBarrierPtr<void>,Memory::Recycler>
            ((FixedFieldInfo *)pPVar15,uVar35,(FixedFieldInfo *)local_428,uVar35);
  this_00 = local_f8;
  uVar7 = Js::FunctionBody::GetPropertyIdFromCacheId(pFVar32,(uint)local_c0);
  this_01 = Js::EntryPointInfo::GetNativeEntryPointData(this_00);
  local_70 = (ulong)uVar7;
  pPVar16 = NativeEntryPointData::RegisterSharedPropertyGuard(this_01,uVar7,pSVar11);
  local_68 = (FunctionBody *)CONCAT44(local_68._4_4_,(int)CONCAT71((int7)((ulong)pPVar16 >> 8),1));
  if ((uVar22 & 1) == 0) {
    if ((((local_98 & 1) == 0) && ((local_84 & 1) == 0)) ||
       (((local_3c & 1) == 0 && (((ulong)local_90 & 1) == 0)))) {
      local_68 = (FunctionBody *)((ulong)local_68._4_4_ << 0x20);
    }
    else {
      iVar17 = FixedFieldInfo::GetFieldValue((FixedFieldInfo *)local_428);
      local_68 = (FunctionBody *)
                 CONCAT44(local_68._4_4_,(int)CONCAT71((int7)((ulong)iVar17 >> 8),iVar17 != 0));
    }
  }
  local_60 = Js::EntryPointInfo::GetJitTransferData(this_00);
  if (local_60 == (JitTransferData *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x423,"(jitTransferData != nullptr)","jitTransferData != nullptr");
    if (!bVar4) goto LAB_0061906c;
    *puVar8 = 0;
  }
  bVar20 = (byte)local_3c | (byte)local_90;
  local_3c = CONCAT31((int3)(local_3c >> 8),bVar20);
  local_c0 = pPVar16;
  if (((bVar20 & 1) == 0) && ((local_38 & 1) == 0)) {
    this_03 = (EquivalentTypeSet *)0x0;
    local_58 = (ObjTypeSpecPolymorphicInfo *)0x0;
    uVar28 = 0;
  }
  else {
    if ((local_38 & 1) == 0) {
      __s = (ObjTypeSpecPolymorphicInfo *)0x0;
      local_78 = 0;
    }
    else {
      SortTypesAndPolymorphicInfo
                ((Type **)&localFixedFieldInfoArray[3].m_data.environmentAddr,
                 (ObjTypeSpecPolymorphicInfo *)(localTypes + 0x1f),&local_32);
      uVar35 = (ulong)local_32;
      local_120 = &ObjTypeSpecPolymorphicInfo::typeinfo;
      fixedFunctionObject = (JavascriptFunction *)0x0;
      local_108 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
      ;
      local_100 = 0x430;
      local_110 = uVar35;
      pRVar14 = Memory::Recycler::TrackAllocInfo
                          (local_50,(TrackAllocData *)&stack0xfffffffffffffee0);
      local_78 = uVar35;
      if (uVar35 == 0) {
        Memory::Recycler::ClearTrackAllocInfo(pRVar14,(TrackAllocData *)0x0);
        __s = (ObjTypeSpecPolymorphicInfo *)&DAT_00000008;
        pvVar18 = extraout_RAX;
      }
      else {
        BVar6 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar6 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar4) goto LAB_0061906c;
          *puVar8 = 0;
        }
        uVar35 = (ulong)(uint)((int)local_78 * 4);
        __s = (ObjTypeSpecPolymorphicInfo *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                        (pRVar14,uVar35);
        if (__s == (ObjTypeSpecPolymorphicInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar4) goto LAB_0061906c;
          *puVar8 = 0;
        }
        pvVar18 = memset(__s,0,uVar35);
      }
      local_d8 = CONCAT62((int6)((ulong)pvVar18 >> 0x10),0xffff);
    }
    uVar28 = local_32;
    uVar35 = (ulong)local_32;
    local_120 = &JITTypeHolderBase<Memory::Recycler>::typeinfo;
    fixedFunctionObject = (JavascriptFunction *)0x0;
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
    ;
    local_100 = 0x433;
    local_110 = uVar35;
    pRVar14 = Memory::Recycler::TrackAllocInfo(local_50,(TrackAllocData *)&stack0xfffffffffffffee0);
    local_58 = __s;
    if (uVar35 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar14,(TrackAllocData *)0x0);
      types = (RecyclerJITTypeHolder *)&DAT_00000008;
    }
    else {
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_0061906c;
        *puVar8 = 0;
      }
      types = (RecyclerJITTypeHolder *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                        (pRVar14,(ulong)((uint)uVar28 * 8));
      if (types == (RecyclerJITTypeHolder *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) goto LAB_0061906c;
        *puVar8 = 0;
      }
      lVar21 = 0;
      do {
        JITTypeHolderBase<Memory::Recycler>::JITTypeHolderBase
                  ((JITTypeHolderBase<Memory::Recycler> *)((long)&(types->t).ptr + lVar21));
        lVar21 = lVar21 + 8;
      } while ((ulong)uVar28 * 8 != lVar21);
    }
    if (local_32 != 0) {
      pTVar23 = &localFixedFieldInfoArray[3].m_data.environmentAddr;
      uVar35 = 0;
      addr = types;
      do {
        this = (DynamicType *)pTVar23->ptr;
        JitTransferData::AddJitTimeTypeRef(local_60,this,local_50);
        if ((((char)local_68 != '\0') &&
            (bVar4 = Js::DynamicType::Is((this->super_Type).typeId), bVar4)) &&
           (this->isLocked == false)) {
          Js::DynamicType::LockType(this);
        }
        local_120 = &JITType::typeinfo;
        fixedFunctionObject = (JavascriptFunction *)0x0;
        local_110 = 0xffffffffffffffff;
        local_108 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
        ;
        local_100 = 0x447;
        pRVar14 = Memory::Recycler::TrackAllocInfo
                            (local_50,(TrackAllocData *)&stack0xfffffffffffffee0);
        this_02 = (JITType *)new<Memory::Recycler>(0x40,pRVar14,0x38bbb2);
        JITType::JITType(this_02);
        Memory::Recycler::WBSetBit((char *)addr);
        (addr->t).ptr = this_02;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        JITType::BuildFromJsType((Type *)pTVar23->ptr,(addr->t).ptr);
        if ((local_38 & 1) != 0) {
          local_58[uVar35].m_data = localPolymorphicInfo[uVar35 - 2].m_data;
        }
        uVar35 = uVar35 + 1;
        pTVar23 = pTVar23 + 1;
        addr = addr + 1;
      } while (uVar35 < local_32);
    }
    uVar28 = local_32;
    local_120 = &Js::EquivalentTypeSet::typeinfo;
    fixedFunctionObject = (JavascriptFunction *)0x0;
    local_110 = 0xffffffffffffffff;
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
    ;
    local_100 = 0x450;
    pRVar14 = Memory::Recycler::TrackAllocInfo(local_50,(TrackAllocData *)&stack0xfffffffffffffee0);
    this_03 = (EquivalentTypeSet *)new<Memory::Recycler>(0x10,pRVar14,0x38bbb2);
    Js::EquivalentTypeSet::EquivalentTypeSet(this_03,types,uVar28);
    if ((local_38 & 1) != 0) {
      this_03->sortedAndDuplicatesRemoved = true;
    }
    uVar28 = (uint16)local_78;
  }
  bVar20 = (byte)local_3c;
  local_120 = &typeinfo;
  fixedFunctionObject = (JavascriptFunction *)0x0;
  local_110 = 0xffffffffffffffff;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
  ;
  local_100 = 0x45a;
  pRVar14 = Memory::Recycler::TrackAllocInfo(local_50,(TrackAllocData *)&stack0xfffffffffffffee0);
  this_04 = (ObjTypeSpecFldInfo *)new<Memory::Recycler>(0x50,pRVar14,0x38bbb2);
  local_50 = (Recycler *)(local_d8 & 0xffff);
  ObjTypeSpecFldInfo(this_04,local_c4,local_9c,(JITType *)0x0,this_03,
                     (bool)((byte)fixedProperty & 1),(bool)((byte)local_98 & 1),
                     (bool)((byte)local_b0 & 1),SUB81(local_68,0),SUB81(local_68,0),
                     (bool)((bVar20 ^ 1) & 1),true,(uint16)local_d8,(PropertyId)local_70,local_d0,
                     local_c0,(JITTimeConstructorCache *)0x0,(FixedFieldInfo *)local_80,
                     (uint16)local_48,uVar28,local_58);
  pFVar32 = local_b8;
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_b8);
  if ((pFVar32->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_0061906c;
    *puVar8 = 0;
    pFVar32 = local_b8;
  }
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015cd718,ObjTypeSpecPhase,uVar5,
                     ((pFVar32->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
                     functionId);
  if (!bVar4) {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar32);
    if ((pFVar32->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) goto LAB_0061906c;
      *puVar8 = 0;
      pFVar32 = local_b8;
    }
    bVar4 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015cd718,EquivObjTypeSpecPhase,uVar5,
                       ((pFVar32->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                       ->functionId);
    if (!bVar4) {
      return this_04;
    }
  }
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar32);
  if ((pFVar32->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_0061906c;
    *puVar8 = 0;
    pFVar32 = local_b8;
  }
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015cd718,ObjTypeSpecPhase,uVar5,
                     ((pFVar32->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
                     functionId);
  if (bVar4) {
    if (this_03 == (EquivalentTypeSet *)0x0) {
      return this_04;
    }
  }
  else {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar32);
    if ((pFVar32->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) {
LAB_0061906c:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
      pFVar32 = local_b8;
    }
    bVar4 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015cd718,EquivObjTypeSpecPhase,uVar5,
                       ((pFVar32->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                       ->functionId);
    if (this_03 == (EquivalentTypeSet *)0x0) {
      return this_04;
    }
    if (!bVar4) {
      return this_04;
    }
  }
  uVar35 = local_70;
  pPVar12 = Js::ScriptContext::GetPropertyName(local_a8,(PropertyId)local_70);
  Output::Print(L"Created ObjTypeSpecFldInfo: id %u, property %s(#%u), slot %u, type set: ",
                (ulong)local_c4,pPVar12 + 1,uVar35 & 0xffffffff,local_50);
  uVar22 = (uint)local_32;
  if (1 < local_32) {
    iVar29 = 0;
    do {
      JVar19 = Js::EquivalentTypeSet::GetType(this_03,(uint16)iVar29);
      Output::Print(L"0x%p, ",JVar19.t);
      iVar29 = iVar29 + 1;
    } while (uVar22 - 1 != iVar29);
  }
  JVar19 = Js::EquivalentTypeSet::GetType(this_03,(uint16)(uVar22 - 1));
  Output::Print(L"0x%p\n",JVar19.t);
  Output::Flush();
  return this_04;
}

Assistant:

ObjTypeSpecFldInfo* ObjTypeSpecFldInfo::CreateFrom(uint id, Js::PolymorphicInlineCache* cache, uint cacheId,
    Js::EntryPointInfo *entryPoint, Js::FunctionBody* const topFunctionBody, Js::FunctionBody *const functionBody, Js::FieldAccessStatsPtr inlineCacheStats)
{

#ifdef FIELD_ACCESS_STATS
#define IncInlineCacheCount(counter) if (inlineCacheStats) { inlineCacheStats->counter++; }
#else
#define IncInlineCacheCount(counter)
#endif

    Assert(topFunctionBody->HasDynamicProfileInfo());
    auto profileData = topFunctionBody->GetAnyDynamicProfileInfo();

    bool gatherDataForInlining = cache->GetCloneForJitTimeUse() && functionBody->PolyInliningUsingFixedMethodsAllowedByConfigFlags(topFunctionBody);

    if (PHASE_OFF(Js::EquivObjTypeSpecPhase, topFunctionBody) || profileData->IsEquivalentObjTypeSpecDisabled())
    {
        if (!gatherDataForInlining)
        {
            return nullptr;
        }
    }

    Assert(cache->GetSize() < UINT16_MAX);
    Js::InlineCache* inlineCaches = cache->GetInlineCaches();
    Js::DynamicObject* prototypeObject = nullptr;
    Js::DynamicObject* accessorOwnerObject = nullptr;
    Js::TypeId typeId = Js::TypeIds_Limit;
    uint16 polyCacheSize = (uint16)cache->GetSize();
    uint16 firstNonEmptyCacheIndex = UINT16_MAX;
    uint16 slotIndex = 0;
    bool areEquivalent = true;
    bool canDepolymorphize = topFunctionBody != functionBody && !PHASE_OFF(Js::DepolymorphizeInlineesPhase, topFunctionBody);
    bool usesAuxSlot = false;
    bool isProto = false;
    bool isAccessor = false;
    bool isGetterAccessor = false;
    bool isAccessorOnProto = false;

    bool stress = PHASE_STRESS(Js::EquivObjTypeSpecPhase, topFunctionBody);
    bool areStressEquivalent = stress;

    uint16 typeCount = 0;
    for (uint16 i = 0; (areEquivalent || stress || gatherDataForInlining || canDepolymorphize) && i < polyCacheSize; i++)
    {
        Js::InlineCache& inlineCache = inlineCaches[i];
        if (inlineCache.IsEmpty()) continue;

        if (firstNonEmptyCacheIndex == UINT16_MAX)
        {
            if (inlineCache.IsLocal())
            {
                typeId = TypeWithoutAuxSlotTag(inlineCache.u.local.type)->GetTypeId();
                usesAuxSlot = TypeHasAuxSlotTag(inlineCache.u.local.type);
                slotIndex = inlineCache.u.local.slotIndex;
                // We don't support equivalent object type spec for adding properties.
                if (inlineCache.u.local.typeWithoutProperty != nullptr)
                {
                    areEquivalent = false;
                    canDepolymorphize = false;
                }
                gatherDataForInlining = false;
            }
            // Missing properties cannot be treated as equivalent, because for objects with SDTH or DTH, we don't change the object's type
            // when we add a property.  We also don't invalidate proto inline caches (and guards) unless the property being added exists on the proto chain.
            // Missing properties by definition do not exist on the proto chain, so in the end we could have an EquivalentObjTypeSpec cache hit on a
            // property that once was missing, but has since been added. (See OS Bugs 280582).
            else if (inlineCache.IsProto())
            {
                if(!inlineCache.u.proto.isMissing)
                {
                    isProto = true;
                    typeId = TypeWithoutAuxSlotTag(inlineCache.u.proto.type)->GetTypeId();
                    usesAuxSlot = TypeHasAuxSlotTag(inlineCache.u.proto.type);
                    slotIndex = inlineCache.u.proto.slotIndex;
                    prototypeObject = inlineCache.u.proto.prototypeObject;
                }
                else
                {
                    areEquivalent = false;
                    areStressEquivalent = false;
                    canDepolymorphize = false;
                    gatherDataForInlining = false;
                }
            }
            else
            {
                AssertOrFailFast(inlineCache.IsAccessor());
                if (!PHASE_OFF(Js::FixAccessorPropsPhase, functionBody))
                {
                    isAccessor = true;
                    isGetterAccessor = inlineCache.IsGetterAccessor();
                    isAccessorOnProto = inlineCache.u.accessor.isOnProto;
                    accessorOwnerObject = inlineCache.u.accessor.object;
                    typeId = TypeWithoutAuxSlotTag(inlineCache.u.accessor.type)->GetTypeId();
                    usesAuxSlot = TypeHasAuxSlotTag(inlineCache.u.accessor.type);
                    slotIndex = inlineCache.u.accessor.slotIndex;
                }
                else
                {
                    areEquivalent = false;
                    areStressEquivalent = false;
                }
                gatherDataForInlining = false;
            }

            // If we're stressing equivalent object type spec then let's keep trying to find a cache that we could use.
            if (!stress || areStressEquivalent)
            {
                firstNonEmptyCacheIndex = i;
            }
        }
        else
        {
            if (inlineCache.IsLocal())
            {
                if (slotIndex != inlineCache.u.local.slotIndex || usesAuxSlot != TypeHasAuxSlotTag(inlineCache.u.local.type))
                {
                    areEquivalent = false;
                }
                if (isProto || isAccessor || inlineCache.u.local.typeWithoutProperty != nullptr || typeId != TypeWithoutAuxSlotTag(inlineCache.u.local.type)->GetTypeId())
                {
                    areEquivalent = false;
                    canDepolymorphize = false;
                }
                gatherDataForInlining = false;
            }
            else if (inlineCache.IsProto())
            {
                if (slotIndex != inlineCache.u.proto.slotIndex || usesAuxSlot != TypeHasAuxSlotTag(inlineCache.u.proto.type))
                {
                    areEquivalent = false;
                }
                if (!isProto || isAccessor || prototypeObject != inlineCache.u.proto.prototypeObject || typeId != TypeWithoutAuxSlotTag(inlineCache.u.proto.type)->GetTypeId())
                {
                    areEquivalent = false;
                    canDepolymorphize = false;
                }
            }
            else
            {
                // Supporting equivalent obj type spec only for those polymorphic accessor property operations for which
                // 1. the property is on the same prototype, and
                // 2. the types are equivalent.
                //
                // This is done to keep the equivalence check helper as-is
                if (slotIndex != inlineCache.u.accessor.slotIndex || usesAuxSlot != TypeHasAuxSlotTag(inlineCache.u.accessor.type))
                {
                    areEquivalent = false;
                }
                if (!isAccessor || isGetterAccessor != inlineCache.IsGetterAccessor() || !isAccessorOnProto || !inlineCache.u.accessor.isOnProto ||
                    accessorOwnerObject != inlineCache.u.accessor.object || typeId != TypeWithoutAuxSlotTag(inlineCache.u.accessor.type)->GetTypeId())
                {
                    areEquivalent = false;
                    canDepolymorphize = false;
                }
                gatherDataForInlining = false;
            }
        }
        typeCount++;
    }

    if (firstNonEmptyCacheIndex == UINT16_MAX)
    {
        IncInlineCacheCount(emptyPolyInlineCacheCount);
        return nullptr;
    }

    if (cache->GetIgnoreForEquivalentObjTypeSpec())
    {
        areEquivalent = areStressEquivalent = false;
    }

#if ENABLE_FIXED_FIELDS
    gatherDataForInlining = gatherDataForInlining && (typeCount <= 4); // Only support 4-way (max) polymorphic inlining
#else
    gatherDataForInlining = false;
#endif

    bool depolymorphize = false;
    if (!areEquivalent && !areStressEquivalent)
    {
        IncInlineCacheCount(nonEquivPolyInlineCacheCount);
        cache->SetIgnoreForEquivalentObjTypeSpec(true);
        // Only do depolymorphication bookkeeping if we're in an inlinee and types are not equivalent
        depolymorphize = canDepolymorphize;
        if (!gatherDataForInlining && !depolymorphize)
        {
            return nullptr;
        }
    }

    Assert(firstNonEmptyCacheIndex < polyCacheSize);
    Assert(typeId != Js::TypeIds_Limit);
    IncInlineCacheCount(equivPolyInlineCacheCount);

    // If we're stressing equivalent object type spec and the types are not equivalent, let's grab the first one only.
    if (stress && (areEquivalent != areStressEquivalent))
    {
        polyCacheSize = firstNonEmptyCacheIndex + 1;
    }

    Js::ScriptContext* scriptContext = functionBody->GetScriptContext();
    Recycler* recycler = scriptContext->GetRecycler();

    uint16 fixedFunctionCount = 0;

    // Need to create a local array here and not allocate one from the recycler,
    // as the allocation may trigger a GC which can clear the inline caches.
    FixedFieldInfo localFixedFieldInfoArray[Js::DynamicProfileInfo::maxPolymorphicInliningSize] = {};

#if ENABLE_FIXED_FIELDS
    // For polymorphic field loads we only support fixed functions on prototypes. This helps keep the equivalence check helper simple.
    // Since all types in the polymorphic cache share the same prototype, it's enough to grab the fixed function from the prototype object.
    Js::Var fixedProperty = nullptr;
    if ((isProto || isAccessorOnProto) && (areEquivalent || areStressEquivalent))
    {
        const Js::PropertyRecord* propertyRecord = scriptContext->GetPropertyName(functionBody->GetPropertyIdFromCacheId(cacheId));
        if (isProto)
        {
            prototypeObject->GetDynamicType()->GetTypeHandler()->TryUseFixedProperty(propertyRecord, &fixedProperty, (Js::FixedPropertyKind)(Js::FixedPropertyKind::FixedMethodProperty | Js::FixedPropertyKind::FixedDataProperty), scriptContext);
        }
        else if (isAccessorOnProto)
        {
            accessorOwnerObject->GetDynamicType()->GetTypeHandler()->TryUseFixedAccessor(propertyRecord, &fixedProperty, Js::FixedPropertyKind::FixedAccessorProperty, isGetterAccessor, scriptContext);
        }

        FixedFieldInfo::PopulateFixedField(nullptr, fixedProperty, &localFixedFieldInfoArray[0]);

        // TODO (ObjTypeSpec): Enable constructor caches on equivalent polymorphic field loads with fixed functions.
    }
#endif
    // Let's get the types.
    Js::Type* localTypes[MaxPolymorphicInlineCacheSize];
    ObjTypeSpecPolymorphicInfo localPolymorphicInfo[MaxPolymorphicInlineCacheSize];

    uint16 typeNumber = 0;
    for (uint16 i = firstNonEmptyCacheIndex; i < polyCacheSize; i++)
    {
        Js::InlineCache& inlineCache = inlineCaches[i];
        if (inlineCache.IsEmpty()) continue;

        if (inlineCache.IsLocal())
        {
            localTypes[typeNumber] = TypeWithoutAuxSlotTag(inlineCache.u.local.type);
            if (depolymorphize)
            {
                localPolymorphicInfo[typeNumber].SetSlotIndex(inlineCache.u.local.slotIndex);
                localPolymorphicInfo[typeNumber].SetUsesAuxSlot(TypeHasAuxSlotTag(inlineCache.u.local.type));
            }
        }
        else if (inlineCache.IsProto())
        {
            localTypes[typeNumber] = TypeWithoutAuxSlotTag(inlineCache.u.proto.type);
            if (depolymorphize)
            {
                localPolymorphicInfo[typeNumber].SetSlotIndex(inlineCache.u.proto.slotIndex);
                localPolymorphicInfo[typeNumber].SetUsesAuxSlot(TypeHasAuxSlotTag(inlineCache.u.proto.type));
            }
        }
        else
        {
            localTypes[typeNumber] = TypeWithoutAuxSlotTag(inlineCache.u.accessor.type);
            if (depolymorphize)
            {
                localPolymorphicInfo[typeNumber].SetSlotIndex(inlineCache.u.accessor.slotIndex);
                localPolymorphicInfo[typeNumber].SetUsesAuxSlot(TypeHasAuxSlotTag(inlineCache.u.accessor.type));
            }
        }

#if ENABLE_FIXED_FIELDS
        if (gatherDataForInlining)
        {
            Js::JavascriptFunction* fixedFunctionObject = nullptr;
            inlineCache.TryGetFixedMethodFromCache(functionBody, cacheId, &fixedFunctionObject);
            if (!fixedFunctionObject || !fixedFunctionObject->GetFunctionInfo()->HasBody())
            {
                if (!(areEquivalent || areStressEquivalent))
                {
                    // If we reach here only because we are gathering data for inlining, and one of the Inline Caches doesn't have a fixedfunction object, return.
                    return nullptr;
                }
                else
                {
                    // If one of the inline caches doesn't have a fixed function object, abort gathering inlining data.
                    gatherDataForInlining = false;
                    typeNumber++;
                    continue;
                }
            }

            // We got a fixed function object from the cache.

            FixedFieldInfo::PopulateFixedField(localTypes[typeNumber], fixedFunctionObject, &localFixedFieldInfoArray[typeNumber]);

            fixedFunctionCount++;
        }
#endif
        typeNumber++;
    }

    if (isAccessor && gatherDataForInlining)
    {
        Assert(fixedFunctionCount <= 1);
    }

    if (stress && (areEquivalent != areStressEquivalent))
    {
        typeCount = 1;
    }

    AnalysisAssert(typeNumber == typeCount);

    // Now that we've copied all material info into local variables, we can start allocating without fear
    // that a garbage collection will clear any of the live inline caches.

    FixedFieldInfo* fixedFieldInfoArray;
    if (gatherDataForInlining)
    {
        fixedFieldInfoArray = RecyclerNewArrayZ(recycler, FixedFieldInfo, fixedFunctionCount);
        CopyArray<FixedFieldInfo, Field(Js::Var)>(
            fixedFieldInfoArray, fixedFunctionCount, localFixedFieldInfoArray, fixedFunctionCount);
    }
    else
    {
        fixedFieldInfoArray = RecyclerNewArrayZ(recycler, FixedFieldInfo, 1);
        CopyArray<FixedFieldInfo, Field(Js::Var)>(fixedFieldInfoArray, 1, localFixedFieldInfoArray, 1);
    }

    Js::PropertyId propertyId = functionBody->GetPropertyIdFromCacheId(cacheId);
    Js::PropertyGuard* propertyGuard = entryPoint->GetNativeEntryPointData()->RegisterSharedPropertyGuard(propertyId, scriptContext);

    // For polymorphic, non-equivalent objTypeSpecFldInfo's, hasFixedValue is true only if each of the inline caches has a fixed function for the given cacheId, or
    // in the case of an accessor cache, only if the there is only one version of the accessor.
    bool hasFixedValue = gatherDataForInlining ||
        ((isProto || isAccessorOnProto) && (areEquivalent || areStressEquivalent) && localFixedFieldInfoArray[0].GetFieldValue());

    bool doesntHaveEquivalence = !(areEquivalent || areStressEquivalent);

    Js::EquivalentTypeSet* typeSet = nullptr;
    ObjTypeSpecPolymorphicInfo * polymorphicInfoArray = nullptr;
    uint16 polymorphicInfoCount = 0;
    auto jitTransferData = entryPoint->GetJitTransferData();
    Assert(jitTransferData != nullptr);
    if (areEquivalent || areStressEquivalent || depolymorphize)
    {
        if (depolymorphize)
        {
            // Because we require the ordering of the polymorphic info to match the equivalent type set, and because there are places in the code
            // where the equivalent type set gets sorted without touching the polymorphic info, and may be more of them in future, just sort
            // them both now before anyone can use them.
            SortTypesAndPolymorphicInfo(localTypes, localPolymorphicInfo, &typeCount);

            // We don't have a single known slot index. We have one per type in the set. GlobOpt will sort out which one to use.
            slotIndex = Js::Constants::NoSlot;
            polymorphicInfoCount = typeCount;
            polymorphicInfoArray = RecyclerNewArrayLeaf(recycler, ObjTypeSpecPolymorphicInfo, typeCount);
        }

        RecyclerJITTypeHolder* types = RecyclerNewArray(recycler, RecyclerJITTypeHolder, typeCount);

        for (uint16 i = 0; i < typeCount; i++)
        {
            jitTransferData->AddJitTimeTypeRef(localTypes[i], recycler);
            if (hasFixedValue)
            {
                // Fixed field checks allow us to assume a specific type ID, but the assumption is only
                // valid if we lock the type. Otherwise, the type ID may change out from under us without
                // evolving the type.
                if (Js::DynamicType::Is(localTypes[i]))
                {
                    Js::DynamicType *dynamicType = static_cast<Js::DynamicType*>(localTypes[i]);
                    if (!dynamicType->GetIsLocked())
                    {
                        dynamicType->LockType();
                    }
                }
            }
            // TODO: OOP JIT, consider putting these inline
            types[i].t = RecyclerNew(recycler, JITType);
            __analysis_assume(localTypes[i] != nullptr);
            JITType::BuildFromJsType(localTypes[i], types[i].t);

            if (depolymorphize)
            {
                polymorphicInfoArray[i] = localPolymorphicInfo[i];
            }
        }
        typeSet = RecyclerNew(recycler, Js::EquivalentTypeSet, types, typeCount);
        if (depolymorphize)
        {
            // We sorted the set above.
            typeSet->SetSortedAndDuplicatesRemoved(true);
        }
    }

    ObjTypeSpecFldInfo* info = RecyclerNew(recycler, ObjTypeSpecFldInfo,
        id, typeId, nullptr, typeSet, usesAuxSlot, isProto, isAccessor, hasFixedValue, hasFixedValue, doesntHaveEquivalence, true, slotIndex, propertyId,
        prototypeObject, propertyGuard, nullptr, fixedFieldInfoArray, fixedFunctionCount, polymorphicInfoCount, polymorphicInfoArray);

    if (PHASE_TRACE(Js::ObjTypeSpecPhase, topFunctionBody) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, topFunctionBody))
    {
        if (PHASE_TRACE(Js::ObjTypeSpecPhase, topFunctionBody) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, topFunctionBody))
        {
            if (typeSet)
            {
                const Js::PropertyRecord* propertyRecord = scriptContext->GetPropertyName(propertyId);
                Output::Print(_u("Created ObjTypeSpecFldInfo: id %u, property %s(#%u), slot %u, type set: "),
                    id, propertyRecord->GetBuffer(), propertyId, slotIndex);
                for (uint16 ti = 0; ti < typeCount - 1; ti++)
                {
                    Output::Print(_u("0x%p, "), typeSet->GetType(ti));
                }
                Output::Print(_u("0x%p\n"), typeSet->GetType(typeCount - 1));
                Output::Flush();
            }
        }
    }

    return info;

#undef IncInlineCacheCount
}